

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

qint64 __thiscall QBuffer::writeData(QBuffer *this,char *data,qint64 len)

{
  bool bVar1;
  QBufferPrivate *pQVar2;
  long lVar3;
  QObject *this_00;
  QObject *pQVar4;
  char *pcVar5;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  quint64 required;
  QBufferPrivate *d;
  char *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  ConnectionType c;
  QObject *obj;
  size_t local_30;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QBuffer *)0x274464);
  lVar3 = (**(code **)(*in_RDI + 0x78))();
  this_00 = (QObject *)(lVar3 + in_RDX);
  obj = this_00;
  pQVar4 = (QObject *)QByteArray::size(pQVar2->buf);
  if (pQVar4 < this_00) {
    QByteArray::resize((QByteArray *)this_00,(qsizetype)in_RDI);
    pQVar4 = (QObject *)QByteArray::size(pQVar2->buf);
    if (pQVar4 != obj) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,(char *)in_RDI,
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
      QMessageLogger::warning(&local_28,"QBuffer::writeData: Memory allocation error");
      local_30 = 0xffffffffffffffff;
      goto LAB_002745b0;
    }
  }
  pcVar5 = QByteArray::data(in_stack_ffffffffffffff90);
  lVar3 = (**(code **)(*in_RDI + 0x78))();
  c = (ConnectionType)((ulong)in_RDI >> 0x20);
  memcpy(pcVar5 + lVar3,in_RSI,in_RDX);
  pQVar2->writtenSinceLastEmit = in_RDX + pQVar2->writtenSinceLastEmit;
  local_30 = in_RDX;
  if (((pQVar2->signalConnectionCount != 0) && ((pQVar2->signalsEmitted & 1U) == 0)) &&
     (bVar1 = QObject::signalsBlocked((QObject *)0x274580), !bVar1)) {
    pQVar2->signalsEmitted = true;
    QMetaObject::invokeMethod<>(obj,(char *)this_00,c);
  }
LAB_002745b0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

qint64 QBuffer::writeData(const char *data, qint64 len)
{
    Q_D(QBuffer);
    const quint64 required = quint64(pos()) + quint64(len); // cannot overflow (pos() ≥ 0, len ≥ 0)

    if (required > quint64(d->buf->size())) { // capacity exceeded
        // The following must hold, since qsizetype covers half the virtual address space:
        Q_ASSERT(required <= quint64((std::numeric_limits<qsizetype>::max)()));
        d->buf->resize(qsizetype(required));
        if (quint64(d->buf->size()) != required) { // could not resize
            qWarning("QBuffer::writeData: Memory allocation error");
            return -1;
        }
    }

    memcpy(d->buf->data() + pos(), data, size_t(len));

#ifndef QT_NO_QOBJECT
    d->writtenSinceLastEmit += len;
    if (d->signalConnectionCount && !d->signalsEmitted && !signalsBlocked()) {
        d->signalsEmitted = true;
        QMetaObject::invokeMethod(this, "_q_emitSignals", Qt::QueuedConnection);
    }
#endif
    return len;
}